

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O0

Vec_Bit_t * Vec_BitStart(int nSize)

{
  int iVar1;
  Vec_Bit_t *pVVar2;
  Vec_Bit_t *p;
  int nSize_local;
  
  iVar1 = (nSize >> 5) + (uint)((nSize & 0x1fU) != 0);
  pVVar2 = Vec_BitAlloc(iVar1 * 0x20);
  pVVar2->nSize = iVar1 * 0x20;
  memset(pVVar2->pArray,0,(long)iVar1 << 2);
  return pVVar2;
}

Assistant:

static inline Vec_Bit_t * Vec_BitStart( int nSize )
{
    Vec_Bit_t * p;
    nSize = (nSize >> 5) + ((nSize & 31) > 0);
    p = Vec_BitAlloc( nSize * 32 );
    p->nSize = nSize * 32;
    memset( p->pArray, 0, sizeof(int) * nSize );
    return p;
}